

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack1to16.h
# Opt level: O0

void ncnn::conv1x1s1_sgemm_pack1to16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined8 *in_RDI;
  Mat bottom_im2col;
  int size;
  int h;
  int w;
  Option *in_stack_00000f10;
  Mat *in_stack_00000f18;
  Mat *in_stack_00000f20;
  Mat *in_stack_00000f28;
  Mat *in_stack_00000f30;
  void *local_e0;
  int *local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  long *local_c0;
  undefined4 local_b8;
  int local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined8 local_a0;
  int local_94;
  int local_90;
  int local_8c;
  void **local_60;
  int local_40;
  undefined4 local_3c;
  void **local_38;
  void **local_28;
  void *local_20;
  int local_10;
  undefined4 local_c;
  void **local_8;
  
  local_8c = *(int *)((long)in_RDI + 0x2c);
  local_90 = *(int *)(in_RDI + 6);
  local_b4 = local_8c * local_90;
  local_28 = &local_e0;
  local_e0 = (void *)*in_RDI;
  local_d8 = (int *)in_RDI[1];
  local_d0 = in_RDI[2];
  local_c8 = *(undefined4 *)(in_RDI + 3);
  local_c0 = (long *)in_RDI[4];
  local_b8 = *(undefined4 *)(in_RDI + 5);
  local_ac = *(undefined4 *)((long)in_RDI + 0x34);
  local_a8 = *(undefined4 *)(in_RDI + 7);
  local_a0 = in_RDI[8];
  if (local_d8 != (int *)0x0) {
    local_c = 1;
    LOCK();
    local_10 = *local_d8;
    *local_d8 = *local_d8 + 1;
    UNLOCK();
  }
  local_b0 = 1;
  local_94 = local_b4;
  local_8 = local_28;
  im2col_sgemm_pack1to16_avx512
            (in_stack_00000f30,in_stack_00000f28,in_stack_00000f20,in_stack_00000f18,
             in_stack_00000f10);
  local_60 = &local_e0;
  if (local_d8 != (int *)0x0) {
    local_3c = 0xffffffff;
    LOCK();
    local_40 = *local_d8;
    *local_d8 = *local_d8 + -1;
    UNLOCK();
    if (local_40 == 1) {
      local_38 = local_60;
      if (local_c0 == (long *)0x0) {
        local_20 = local_e0;
        if (local_e0 != (void *)0x0) {
          free(local_e0);
        }
      }
      else {
        (**(code **)(*local_c0 + 0x18))(local_c0,local_e0);
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s1_sgemm_pack1to16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    const int size = w * h;

    Mat bottom_im2col = bottom_blob;
    bottom_im2col.w = size;
    bottom_im2col.h = 1;

    im2col_sgemm_pack1to16_avx512(bottom_im2col, top_blob, kernel, _bias, opt);
}